

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O3

bool CivetServer::getParam(mg_connection *conn,char *name,string *dst,size_t occurrence)

{
  void *pvVar1;
  iterator __position;
  char *__s;
  bool bVar2;
  uint uVar3;
  mg_request_info *pmVar4;
  vector<char,std::allocator<char>> *this;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  char *__s_00;
  char buf [2048];
  value_type local_849;
  mg_connection *local_848;
  size_t local_840;
  undefined1 local_838 [2056];
  
  local_848 = conn;
  local_840 = occurrence;
  pmVar4 = mg_get_request_info(conn);
  pvVar1 = pmVar4->user_data;
  mg_lock_context(*(mg_context **)((long)pvVar1 + 8));
  this = (vector<char,std::allocator<char>> *)
         std::
         map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
         ::operator[]((map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
                       *)((long)pvVar1 + 0x10),&local_848);
  mg_unlock_context(*(mg_context **)((long)pvVar1 + 8));
  mg_lock_connection(local_848);
  __s_00 = *(char **)this;
  pcVar7 = *(char **)(this + 8);
  if (__s_00 == pcVar7) {
    uVar3 = mg_read(local_848,local_838,0x800);
    if (uVar3 != 0) {
      do {
        if ((int)uVar3 < 0) {
LAB_0010a512:
          local_849 = '\0';
          std::vector<char,_std::allocator<char>_>::_M_fill_assign
                    ((vector<char,_std::allocator<char>_> *)this,1,&local_849);
          goto LAB_0010a536;
        }
        lVar6 = *(long *)(this + 8) - *(long *)this;
        if (0x200000 < lVar6 + (ulong)uVar3) goto LAB_0010a512;
        std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                  (this,*(long *)this + lVar6,local_838,local_838 + uVar3);
        uVar3 = mg_read(local_848,local_838,0x800);
      } while (uVar3 != 0);
    }
    local_849 = '\0';
    __position._M_current = *(char **)(this + 8);
    if (__position._M_current == *(char **)(this + 0x10)) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                ((vector<char,_std::allocator<char>_> *)this,__position,&local_849);
    }
    else {
      *__position._M_current = '\0';
      *(long *)(this + 8) = *(long *)(this + 8) + 1;
    }
LAB_0010a536:
    __s_00 = *(char **)this;
    pcVar7 = *(char **)(this + 8);
  }
  __s = pmVar4->query_string;
  mg_unlock_connection(local_848);
  bVar2 = false;
  if ((__s_00 != (char *)0x0) && (bVar2 = false, __s_00 != pcVar7)) {
    sVar5 = strlen(__s_00);
    bVar2 = getParam(__s_00,sVar5,name,dst,local_840);
  }
  if ((__s != (char *)0x0) && (bVar2 == false)) {
    sVar5 = strlen(__s);
    bVar2 = getParam(__s,sVar5,name,dst,local_840);
  }
  return bVar2;
}

Assistant:

bool
CivetServer::getParam(struct mg_connection *conn,
                      const char *name,
                      std::string &dst,
                      size_t occurrence)
{
	const char *formParams = NULL;
	const char *queryString = NULL;
	const struct mg_request_info *ri = mg_get_request_info(conn);
	assert(ri != NULL);
	CivetServer *me = (CivetServer *)(ri->user_data);
	assert(me != NULL);
	mg_lock_context(me->context);
	CivetConnection &conobj = me->connections[conn];
	mg_unlock_context(me->context);

	mg_lock_connection(conn);
	if (conobj.postData.empty()) {
		// check if there is a request body
		for (;;) {
			char buf[2048];
			int r = mg_read(conn, buf, sizeof(buf));
			try {
				if (r == 0) {
					conobj.postData.push_back('\0');
					break;
				} else if ((r < 0)
				           || ((conobj.postData.size() + r)
				               > MAX_PARAM_BODY_LENGTH)) {
					conobj.postData.assign(1, '\0');
					break;
				}
				conobj.postData.insert(conobj.postData.end(), buf, buf + r);
			} catch (...) {
				conobj.postData.clear();
				break;
			}
		}
	}
	if (!conobj.postData.empty()) {
		// check if form parameter are already stored
		formParams = &conobj.postData[0];
	}

	if (ri->query_string != NULL) {
		// get requests do store html <form> field values in the http
		// query_string
		queryString = ri->query_string;
	}

	mg_unlock_connection(conn);

	bool get_param_success = false;
	if (formParams != NULL) {
		get_param_success =
		    getParam(formParams, strlen(formParams), name, dst, occurrence);
	}
	if (!get_param_success && queryString != NULL) {
		get_param_success =
		    getParam(queryString, strlen(queryString), name, dst, occurrence);
	}

	return get_param_success;
}